

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O3

void av1_highbd_convolve_x_sr_avx2
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  undefined4 uVar1;
  ushort uVar2;
  uint uVar3;
  int16_t *piVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  long lVar13;
  uint uVar14;
  long lVar15;
  undefined1 (*pauVar16) [32];
  undefined2 uVar17;
  undefined1 (*pauVar18) [16];
  undefined2 uVar19;
  undefined1 (*pauVar20) [32];
  int iVar21;
  ulong uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  
  uVar2 = filter_params_x->taps;
  if (uVar2 != 0xc) {
    uVar14 = 7 - conv_params->round_0;
    uVar19 = 0xff;
    if (bd == 0xc) {
      uVar19 = 0xfff;
    }
    uVar17 = 0x3ff;
    if (bd != 10) {
      uVar17 = uVar19;
    }
    if (0 < w) {
      pauVar16 = (undefined1 (*) [32])(src + (1 - (ulong)(uVar2 >> 1)));
      iVar21 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
      auVar23._4_4_ = iVar21;
      auVar23._0_4_ = iVar21;
      auVar23._8_4_ = iVar21;
      auVar23._12_4_ = iVar21;
      auVar23._16_4_ = iVar21;
      auVar23._20_4_ = iVar21;
      auVar23._24_4_ = iVar21;
      auVar23._28_4_ = iVar21;
      uVar3 = conv_params->round_0;
      iVar21 = (1 << ((byte)uVar14 & 0x1f)) >> 1;
      auVar24._4_4_ = iVar21;
      auVar24._0_4_ = iVar21;
      auVar24._8_4_ = iVar21;
      auVar24._12_4_ = iVar21;
      auVar24._16_4_ = iVar21;
      auVar24._20_4_ = iVar21;
      auVar24._24_4_ = iVar21;
      auVar24._28_4_ = iVar21;
      piVar4 = filter_params_x->filter_ptr;
      uVar22 = (ulong)((subpel_x_qn & 0xfU) * (uint)uVar2);
      uVar1 = *(undefined4 *)(piVar4 + uVar22 + 6);
      auVar25._4_4_ = uVar1;
      auVar25._0_4_ = uVar1;
      auVar25._8_4_ = uVar1;
      auVar25._12_4_ = uVar1;
      auVar25._16_4_ = uVar1;
      auVar25._20_4_ = uVar1;
      auVar25._24_4_ = uVar1;
      auVar25._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(piVar4 + uVar22 + 4);
      auVar26._4_4_ = uVar1;
      auVar26._0_4_ = uVar1;
      auVar26._8_4_ = uVar1;
      auVar26._12_4_ = uVar1;
      auVar26._16_4_ = uVar1;
      auVar26._20_4_ = uVar1;
      auVar26._24_4_ = uVar1;
      auVar26._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(piVar4 + uVar22 + 2);
      auVar27._4_4_ = uVar1;
      auVar27._0_4_ = uVar1;
      auVar27._8_4_ = uVar1;
      auVar27._12_4_ = uVar1;
      auVar27._16_4_ = uVar1;
      auVar27._20_4_ = uVar1;
      auVar27._24_4_ = uVar1;
      auVar27._28_4_ = uVar1;
      auVar28._2_2_ = uVar17;
      auVar28._0_2_ = uVar17;
      auVar28._4_2_ = uVar17;
      auVar28._6_2_ = uVar17;
      auVar28._8_2_ = uVar17;
      auVar28._10_2_ = uVar17;
      auVar28._12_2_ = uVar17;
      auVar28._14_2_ = uVar17;
      auVar28._16_2_ = uVar17;
      auVar28._18_2_ = uVar17;
      auVar28._20_2_ = uVar17;
      auVar28._22_2_ = uVar17;
      auVar28._24_2_ = uVar17;
      auVar28._26_2_ = uVar17;
      auVar28._28_2_ = uVar17;
      auVar28._30_2_ = uVar17;
      uVar1 = *(undefined4 *)(piVar4 + uVar22);
      auVar29._4_4_ = uVar1;
      auVar29._0_4_ = uVar1;
      auVar29._8_4_ = uVar1;
      auVar29._12_4_ = uVar1;
      auVar29._16_4_ = uVar1;
      auVar29._20_4_ = uVar1;
      auVar29._24_4_ = uVar1;
      auVar29._28_4_ = uVar1;
      lVar13 = (long)dst_stride;
      uVar22 = 0;
      do {
        if (0 < h) {
          lVar15 = 0;
          pauVar18 = (undefined1 (*) [16])dst;
          pauVar20 = pauVar16;
          do {
            auVar11 = vperm2i128_avx2(*pauVar20,
                                      *(undefined1 (*) [32])(*pauVar20 + (long)src_stride * 2),0x20)
            ;
            auVar12 = vperm2i128_avx2(*pauVar20,
                                      *(undefined1 (*) [32])(*pauVar20 + (long)src_stride * 2),0x31)
            ;
            auVar5 = vpalignr_avx2(auVar12,auVar11,4);
            auVar6 = vpalignr_avx2(auVar12,auVar11,8);
            auVar7 = vpalignr_avx2(auVar12,auVar11,0xc);
            auVar8 = vpmaddwd_avx2(auVar11,auVar29);
            auVar9 = vpmaddwd_avx2(auVar5,auVar27);
            auVar5 = vpmaddwd_avx2(auVar6,auVar26);
            auVar6 = vpmaddwd_avx2(auVar7,auVar25);
            auVar5 = vpaddd_avx2(auVar5,auVar6);
            auVar6 = vpaddd_avx2(auVar8,auVar23);
            auVar6 = vpaddd_avx2(auVar6,auVar9);
            auVar5 = vpaddd_avx2(auVar6,auVar5);
            auVar10 = vpsrad_avx2(auVar5,ZEXT416(uVar3));
            auVar5 = vpalignr_avx2(auVar12,auVar11,2);
            auVar6 = vpalignr_avx2(auVar12,auVar11,6);
            auVar7 = vpalignr_avx2(auVar12,auVar11,10);
            auVar8 = vpalignr_avx2(auVar12,auVar11,0xe);
            auVar9 = vpmaddwd_avx2(auVar5,auVar29);
            auVar5 = vpmaddwd_avx2(auVar6,auVar27);
            auVar6 = vpmaddwd_avx2(auVar7,auVar26);
            auVar5 = vpaddd_avx2(auVar5,auVar6);
            auVar7 = vpmaddwd_avx2(auVar8,auVar25);
            auVar6 = vpaddd_avx2(auVar9,auVar23);
            auVar5 = vpaddd_avx2(auVar6,auVar5);
            auVar5 = vpaddd_avx2(auVar5,auVar7);
            auVar6 = vpsrad_avx2(auVar5,ZEXT416(uVar3));
            auVar5 = vpaddd_avx2(auVar10,auVar24);
            auVar5 = vpsrad_avx2(auVar5,ZEXT416(uVar14));
            auVar5 = vpackssdw_avx2(auVar5,auVar23);
            auVar6 = vpaddd_avx2(auVar6,auVar24);
            auVar6 = vpsrad_avx2(auVar6,ZEXT416(uVar14));
            auVar6 = vpackssdw_avx2(auVar6,auVar23);
            auVar5 = vpunpcklwd_avx2(auVar5,auVar6);
            auVar5 = vpminsw_avx2(auVar5,auVar28);
            auVar5 = vpmaxsw_avx2(auVar5,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            if ((long)uVar22 < (long)((ulong)(uint)w - 4)) {
              *pauVar18 = auVar5._0_16_;
              *(undefined1 (*) [16])((long)*pauVar18 + lVar13 * 2) = auVar5._16_16_;
            }
            else if (w == 4) {
              *(long *)*pauVar18 = auVar5._0_8_;
              *(long *)((long)*pauVar18 + lVar13 * 2) = auVar5._16_8_;
            }
            else {
              *(int *)*pauVar18 = auVar5._0_4_;
              *(int *)((long)*pauVar18 + lVar13 * 2) = auVar5._16_4_;
            }
            lVar15 = lVar15 + 2;
            pauVar20 = (undefined1 (*) [32])(*pauVar20 + (long)src_stride * 4);
            pauVar18 = (undefined1 (*) [16])((long)*pauVar18 + lVar13 * 2 * 2);
          } while (lVar15 < h);
        }
        uVar22 = uVar22 + 8;
        pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
        dst = (uint16_t *)((long)dst + 0x10);
      } while (uVar22 < (uint)w);
    }
    return;
  }
  av1_highbd_convolve_x_sr_ssse3
            (src,src_stride,dst,dst_stride,w,h,filter_params_x,subpel_x_qn,conv_params,bd);
  return;
}

Assistant:

void av1_highbd_convolve_x_sr_avx2(const uint16_t *src, int src_stride,
                                   uint16_t *dst, int dst_stride, int w, int h,
                                   const InterpFilterParams *filter_params_x,
                                   const int subpel_x_qn,
                                   ConvolveParams *conv_params, int bd) {
  if (filter_params_x->taps == 12) {
    av1_highbd_convolve_x_sr_ssse3(src, src_stride, dst, dst_stride, w, h,
                                   filter_params_x, subpel_x_qn, conv_params,
                                   bd);
    return;
  }
  int i, j;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_horiz;

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  __m256i s[4], coeffs_x[4];

  const __m256i round_const_x =
      _mm256_set1_epi32(((1 << conv_params->round_0) >> 1));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);

  const int bits = FILTER_BITS - conv_params->round_0;
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);
  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();

  assert(bits >= 0);
  assert((FILTER_BITS - conv_params->round_1) >= 0 ||
         ((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS));

  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    for (i = 0; i < h; i += 2) {
      const __m256i row0 =
          _mm256_loadu_si256((__m256i *)&src_ptr[i * src_stride + j]);
      __m256i row1 =
          _mm256_loadu_si256((__m256i *)&src_ptr[(i + 1) * src_stride + j]);

      const __m256i r0 = _mm256_permute2x128_si256(row0, row1, 0x20);
      const __m256i r1 = _mm256_permute2x128_si256(row0, row1, 0x31);

      // even pixels
      s[0] = _mm256_alignr_epi8(r1, r0, 0);
      s[1] = _mm256_alignr_epi8(r1, r0, 4);
      s[2] = _mm256_alignr_epi8(r1, r0, 8);
      s[3] = _mm256_alignr_epi8(r1, r0, 12);

      __m256i res_even = convolve(s, coeffs_x);
      res_even = _mm256_sra_epi32(_mm256_add_epi32(res_even, round_const_x),
                                  round_shift_x);

      // odd pixels
      s[0] = _mm256_alignr_epi8(r1, r0, 2);
      s[1] = _mm256_alignr_epi8(r1, r0, 6);
      s[2] = _mm256_alignr_epi8(r1, r0, 10);
      s[3] = _mm256_alignr_epi8(r1, r0, 14);

      __m256i res_odd = convolve(s, coeffs_x);
      res_odd = _mm256_sra_epi32(_mm256_add_epi32(res_odd, round_const_x),
                                 round_shift_x);

      res_even = _mm256_sra_epi32(_mm256_add_epi32(res_even, round_const_bits),
                                  round_shift_bits);
      res_odd = _mm256_sra_epi32(_mm256_add_epi32(res_odd, round_const_bits),
                                 round_shift_bits);

      __m256i res_even1 = _mm256_packs_epi32(res_even, res_even);
      __m256i res_odd1 = _mm256_packs_epi32(res_odd, res_odd);

      __m256i res = _mm256_unpacklo_epi16(res_even1, res_odd1);
      res = _mm256_min_epi16(res, clip_pixel);
      res = _mm256_max_epi16(res, zero);

      if (w - j > 4) {
        _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j],
                         _mm256_castsi256_si128(res));
        _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j + dst_stride],
                         _mm256_extracti128_si256(res, 1));
      } else if (w == 4) {
        _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j],
                         _mm256_castsi256_si128(res));
        _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                         _mm256_extracti128_si256(res, 1));
      } else {
        xx_storel_32(&dst[i * dst_stride + j], _mm256_castsi256_si128(res));
        xx_storel_32(&dst[i * dst_stride + j + dst_stride],
                     _mm256_extracti128_si256(res, 1));
      }
    }
  }
}